

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodegenerator.cpp
# Opt level: O2

void stackjit::ByteCodeGenerator::generateFunction(ostream *stream,Function *function)

{
  pointer pbVar1;
  pointer pIVar2;
  _Alloc_hider _Var3;
  size_type sVar4;
  bool bVar5;
  InstructionFormats IVar6;
  char cVar7;
  int iVar8;
  ostream *poVar9;
  AttributeContainer *attributes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar10;
  vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_> *pvVar11;
  mapped_type *pmVar12;
  string *psVar13;
  Function *function_00;
  Function *function_01;
  size_type sVar14;
  pointer pbVar15;
  char *pcVar16;
  pointer this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local;
  float fVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameter;
  mapped_type opCode;
  string local_90;
  string local_70;
  string local_50;
  
  bVar5 = Loader::Function::isExternal(function);
  if (bVar5) {
    poVar9 = std::operator<<(stream,"extern ");
    Loader::getSignature_abi_cxx11_(&local_70,(Loader *)function,function_00);
    poVar9 = std::operator<<(poVar9,(string *)&local_70);
    poVar9 = std::operator<<(poVar9," ");
    Loader::Function::returnType_abi_cxx11_(&local_90,function);
    poVar9 = std::operator<<(poVar9,(string *)&local_90);
    std::endl<char,std::char_traits<char>>(poVar9);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
  }
  else {
    bVar5 = Loader::Function::isMemberFunction(function);
    pcVar16 = "func ";
    if (bVar5) {
      pcVar16 = "member ";
    }
    std::operator<<(stream,pcVar16);
    Loader::getSignature_abi_cxx11_(&local_70,(Loader *)function,function_01);
    poVar9 = std::operator<<(stream,(string *)&local_70);
    poVar9 = std::operator<<(poVar9," ");
    Loader::Function::returnType_abi_cxx11_(&local_90,function);
    poVar9 = std::operator<<(poVar9,(string *)&local_90);
    std::endl<char,std::char_traits<char>>(poVar9);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    poVar9 = std::operator<<(stream,"{");
    std::endl<char,std::char_traits<char>>(poVar9);
    attributes = Loader::Function::attributes_abi_cxx11_(function);
    generateAttributes(stream,attributes);
    pvVar10 = Loader::Function::localTypes_abi_cxx11_(function);
    if ((pvVar10->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish !=
        (pvVar10->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start) {
      poVar9 = std::operator<<(stream,"\t.locals ");
      Loader::Function::localTypes_abi_cxx11_(function);
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      std::endl<char,std::char_traits<char>>(poVar9);
      pvVar10 = Loader::Function::localTypes_abi_cxx11_(function);
      pbVar1 = (pvVar10->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar15 = (pvVar10->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start; pbVar15 != pbVar1;
          pbVar15 = pbVar15 + 1) {
        bVar5 = std::operator!=(pbVar15,"");
        if (bVar5) {
          poVar9 = std::operator<<(stream,"\t.local ");
          poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
          poVar9 = std::operator<<(poVar9," ");
          poVar9 = std::operator<<(poVar9,(string *)pbVar15);
          std::endl<char,std::char_traits<char>>(poVar9);
        }
      }
    }
    pvVar11 = Loader::Function::instructions(function);
    pIVar2 = (pvVar11->
             super__Vector_base<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (this = (pvVar11->
                super__Vector_base<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>
                )._M_impl.super__Vector_impl_data._M_start; this != pIVar2; this = this + 1) {
      local_90._M_dataplus._M_p._0_1_ = Loader::Instruction::opCode(this);
      pmVar12 = std::__detail::
                _Map_base<unsigned_char,_std::pair<const_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::at((_Map_base<unsigned_char,_std::pair<const_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      *)(anonymous_namespace)::opCodeTable_abi_cxx11_,(key_type *)&local_90);
      std::__cxx11::string::string((string *)&local_70,(string *)pmVar12);
      sVar4 = local_70._M_string_length;
      _Var3._M_p = local_70._M_dataplus._M_p;
      for (sVar14 = 0; sVar4 != sVar14; sVar14 = sVar14 + 1) {
        iVar8 = toupper((int)_Var3._M_p[sVar14]);
        _Var3._M_p[sVar14] = (char)iVar8;
      }
      poVar9 = std::operator<<(stream,"\t");
      std::operator<<(poVar9,(string *)&local_70);
      IVar6 = Loader::Instruction::format(this);
      switch(IVar6) {
      case IntData:
        poVar9 = std::operator<<(stream," ");
        iVar8 = Loader::Instruction::intValue(this);
        goto LAB_0011e962;
      case FloatData:
        poVar9 = std::operator<<(stream," ");
        fVar17 = Loader::Instruction::floatValue(this);
        std::ostream::operator<<(poVar9,fVar17);
        break;
      case CharData:
        poVar9 = std::operator<<(stream," ");
        cVar7 = Loader::Instruction::charValue(this);
        iVar8 = (int)cVar7;
LAB_0011e962:
        std::ostream::operator<<(poVar9,iVar8);
        break;
      case StringData:
        poVar9 = std::operator<<(stream," ");
        psVar13 = Loader::Instruction::stringValue_abi_cxx11_(this);
        std::operator<<(poVar9,(string *)psVar13);
        break;
      case StringConstantData:
        poVar9 = std::operator<<(stream," ");
        psVar13 = Loader::Instruction::stringValue_abi_cxx11_(this);
        std::__cxx11::string::string((string *)&local_50,(string *)psVar13);
        escapedString(&local_90,&local_50);
        std::operator<<(poVar9,(string *)&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_50);
        break;
      case Call:
        poVar9 = std::operator<<(stream," ");
        psVar13 = Loader::Instruction::stringValue_abi_cxx11_(this);
        std::operator<<(poVar9,(string *)psVar13);
        std::operator<<(stream,"(");
        pvVar10 = Loader::Instruction::callParameters_abi_cxx11_(this);
        pbVar1 = (pvVar10->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        bVar5 = true;
        for (pbVar15 = (pvVar10->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start; pbVar15 != pbVar1;
            pbVar15 = pbVar15 + 1) {
          std::__cxx11::string::string((string *)&local_90,(string *)pbVar15);
          if (!bVar5) {
            std::operator<<(stream," ");
          }
          std::operator<<(stream,(string *)&local_90);
          std::__cxx11::string::~string((string *)&local_90);
          bVar5 = false;
        }
        std::operator<<(stream,")");
        break;
      case CallInstance:
        poVar9 = std::operator<<(stream," ");
        psVar13 = Loader::Instruction::calledClassType_abi_cxx11_(this);
        poVar9 = std::operator<<(poVar9,(string *)psVar13);
        poVar9 = std::operator<<(poVar9,"::");
        psVar13 = Loader::Instruction::stringValue_abi_cxx11_(this);
        std::operator<<(poVar9,(string *)psVar13);
        std::operator<<(stream,"(");
        pvVar10 = Loader::Instruction::callParameters_abi_cxx11_(this);
        pbVar1 = (pvVar10->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        bVar5 = true;
        for (pbVar15 = (pvVar10->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start; pbVar15 != pbVar1;
            pbVar15 = pbVar15 + 1) {
          std::__cxx11::string::string((string *)&local_90,(string *)pbVar15);
          if (!bVar5) {
            std::operator<<(stream," ");
          }
          std::operator<<(stream,(string *)&local_90);
          std::__cxx11::string::~string((string *)&local_90);
          bVar5 = false;
        }
        std::operator<<(stream,")");
      }
      std::endl<char,std::char_traits<char>>(stream);
      std::__cxx11::string::~string((string *)&local_70);
    }
    poVar9 = std::operator<<(stream,"}");
    std::endl<char,std::char_traits<char>>(poVar9);
  }
  return;
}

Assistant:

void ByteCodeGenerator::generateFunction(std::ostream& stream, const Loader::Function& function) {
		if (function.isExternal()) {
			stream << "extern " << Loader::getSignature(function) << " " << function.returnType() << std::endl;
		} else {
			if (function.isMemberFunction()) {
				stream << "member ";
			} else {
				stream << "func ";
			}

			stream << Loader::getSignature(function) << " " << function.returnType() << std::endl;

			stream << "{" << std::endl;

			ByteCodeGenerator::generateAttributes(stream, function.attributes());

			if (function.localTypes().size() > 0) {
				stream << "\t.locals " << function.localTypes().size() << std::endl;

				std::size_t i = 0;
				for (auto& local : function.localTypes()) {
					if (local != "") {
						stream << "\t.local " << i << " " << local << std::endl;
					}
					i++;
				}
			}

			for (auto& inst : function.instructions()) {
				auto opCode = opCodeTable.at((unsigned char)inst.opCode());
				std::transform(opCode.begin(), opCode.end(), opCode.begin(), ::toupper);
				stream << "\t" << opCode;

				switch (inst.format()) {
					case Loader::InstructionFormats::OpCodeOnly:
						break;
					case Loader::InstructionFormats::IntData:
						stream << " " << inst.intValue();
						break;
					case Loader::InstructionFormats::FloatData:
						stream << " " << inst.floatValue();
						break;
					case Loader::InstructionFormats::CharData:
						stream << " " << (int)inst.charValue();
						break;
					case Loader::InstructionFormats::StringData:
						stream << " " << inst.stringValue();
						break;
					case Loader::InstructionFormats::StringConstantData:
						stream << " " << escapedString(inst.stringValue());
						break;
					case Loader::InstructionFormats::Call: {
						stream << " " << inst.stringValue();
						stream << "(";
						bool isFirst = true;

						for (auto parameter : inst.callParameters()) {
							if (!isFirst) {
								stream << " ";
							} else {
								isFirst = false;
							}

							stream << parameter;
						}

						stream << ")";
						break;
					}
					case Loader::InstructionFormats::CallInstance: {
						stream << " " << inst.calledClassType() << "::" << inst.stringValue();
						stream << "(";
						bool isFirst = true;

						for (auto parameter : inst.callParameters()) {
							if (!isFirst) {
								stream << " ";
							} else {
								isFirst = false;
							}

							stream << parameter;
						}

						stream << ")";
						break;
					}
				}

				stream << std::endl;
			}

			stream << "}" << std::endl;
		}
	}